

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::get_subpass_meta_for_pipeline
          (Impl *this,VkGraphicsPipelineCreateInfo *create_info,Hash render_pass_hash,
          SubpassMeta *meta)

{
  bool bVar1;
  bool bVar2;
  VkGraphicsPipelineLibraryCreateInfoEXT *pVVar3;
  VkPipelineRenderingCreateInfo *pVVar4;
  bool local_52;
  VkPipelineRenderingCreateInfo *rendering_create_info;
  bool output;
  bool fragment;
  bool force_depth_stencil;
  VkGraphicsPipelineLibraryCreateInfoEXT *library_info;
  SubpassMeta *meta_local;
  Hash render_pass_hash_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Impl *this_local;
  
  pVVar3 = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>
                     (VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT,create_info->pNext
                     );
  bVar1 = false;
  if ((render_pass_hash == 0) && (pVVar3 != (VkGraphicsPipelineLibraryCreateInfoEXT *)0x0)) {
    bVar1 = (pVVar3->flags & 4) != 0 && (pVVar3->flags & 8) == 0;
  }
  if (render_pass_hash == 0) {
    pVVar4 = find_pnext<VkPipelineRenderingCreateInfo>
                       (VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO,create_info->pNext);
    if (pVVar4 == (VkPipelineRenderingCreateInfo *)0x0) {
      meta->uses_color = false;
      meta->uses_depth_stencil = false;
    }
    else {
      meta->uses_color = pVVar4->colorAttachmentCount != 0;
      local_52 = true;
      if (pVVar4->depthAttachmentFormat == VK_FORMAT_UNDEFINED) {
        local_52 = pVVar4->stencilAttachmentFormat != VK_FORMAT_UNDEFINED;
      }
      meta->uses_depth_stencil = local_52;
    }
  }
  else {
    bVar2 = get_subpass_meta_for_render_pass_hash(this,render_pass_hash,create_info->subpass,meta);
    if (!bVar2) {
      return false;
    }
  }
  if (bVar1) {
    meta->uses_depth_stencil = true;
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::get_subpass_meta_for_pipeline(const VkGraphicsPipelineCreateInfo &create_info,
                                                        Hash render_pass_hash,
                                                        SubpassMeta *meta) const
{
	auto *library_info = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>(
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT, create_info.pNext);
	bool force_depth_stencil = false;

	if (!render_pass_hash && library_info)
	{
		// If we have fragment shaders, but no idea what our render pass looks like,
		// we might be forced to emit depth stencil state, even if we don't end up needing it.
		// VUID we consider here:
		// If renderPass is VK_NULL_HANDLE and the pipeline is being created with fragment shader state
		// but not fragment output interface state,
		// pDepthStencilState must be a valid pointer to a valid VkPipelineDepthStencilStateCreateInfo structure
		bool fragment = (library_info->flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT) != 0;
		bool output = (library_info->flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) != 0;
		force_depth_stencil = fragment && !output;
	}

	// If a render pass is present, use that.
	if (render_pass_hash)
	{
		if (!get_subpass_meta_for_render_pass_hash(render_pass_hash, create_info.subpass, meta))
			return false;
	}
	else if (auto *rendering_create_info = find_pnext<VkPipelineRenderingCreateInfoKHR>(
			VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR, create_info.pNext))
	{
		meta->uses_color = rendering_create_info->colorAttachmentCount > 0;
		meta->uses_depth_stencil = rendering_create_info->depthAttachmentFormat != VK_FORMAT_UNDEFINED ||
		                           rendering_create_info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED;
	}
	else
	{
		meta->uses_color = false;
		meta->uses_depth_stencil = false;
	}

	if (force_depth_stencil)
		meta->uses_depth_stencil = true;

	return true;
}